

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_TrimmedExponential_Test::TestBody(Sampling_TrimmedExponential_Test *this)

{
  Float max;
  undefined1 auVar1 [16];
  float fVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float *pfVar5;
  size_t sVar6;
  Allocator AVar7;
  long lVar8;
  char *pcVar9;
  char *in_R9;
  undefined1 auVar10 [16];
  float u;
  Float FVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  span<const_float> f;
  AssertHelper local_1a8;
  Float local_1a0;
  Float c;
  AssertionResult gtest_ar_;
  Float dp;
  Float local_17c;
  AssertionResult gtest_ar;
  AssertHelper local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  Uniform1DIter __begin2;
  Float local_f8 [10];
  IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> local_d0 [2];
  undefined8 local_c8;
  undefined8 local_c0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Uniform1DIter __end2;
  PiecewiseConstant1D distrib;
  undefined1 extraout_var [60];
  
  local_f8[8] = 0.0;
  local_f8[2] = 0.0;
  local_f8[5] = 0.0;
  local_f8[0] = 1.0;
  local_f8[1] = 2.0;
  local_f8[3] = 5.0;
  local_f8[4] = 10.0;
  local_f8[6] = 0.25;
  local_f8[7] = 20.0;
  for (lVar8 = 0; lVar8 != 0x24; lVar8 = lVar8 + 0xc) {
    c = *(Float *)((long)local_f8 + lVar8);
    max = *(Float *)((long)local_f8 + lVar8 + 4);
    local_130._8_8_ = 0;
    local_130._M_unused._M_object = &c;
    local_118 = std::
                _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:848:20)>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:848:20)>
                ::_M_manager;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction(&values,(function<float_(float)> *)&local_130,0x8000,0x10,0.0,max,AVar7);
    std::_Function_base::~_Function_base((_Function_base *)&local_130);
    sVar6 = values.nStored;
    pfVar5 = values.ptr;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar6;
    f.ptr = pfVar5;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&distrib,f,0.0,max,AVar7);
    local_d0[0].n = 100;
    local_c8 = 0;
    local_c0 = 0x853c49e6748fea9b;
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
              (&__begin2,local_d0);
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
              (&__end2,local_d0);
    for (; __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i !=
           __end2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
        __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
        super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
             __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
             super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
      u = pbrt::RNG::Uniform<float>(&__begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
      local_1a0 = pbrt::SampleTrimmedExponential(u,c,max);
      FVar11 = pbrt::TrimmedExponentialPDF(local_1a0,c,max);
      local_17c = pbrt::PiecewiseConstant1D::Sample(&distrib,u,&dp,(int *)0x0);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f847ae147ae14;
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(local_1a0 - local_17c)),auVar10);
      local_1a8.data_._0_4_ = auVar10._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs(cx - dx)","1e-2",(float *)&local_1a8,
                 (double *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),local_1a0);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),local_17c);
        pcVar9 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x35a,pcVar9);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f847ae147ae14;
      auVar1._8_4_ = 0x7fffffff;
      auVar1._0_8_ = 0x7fffffff7fffffff;
      auVar1._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(FVar11 - dp)),auVar1);
      local_1a8.data_._0_4_ = auVar10._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs(cp - dp)","1e-2",(float *)&local_1a8,
                 (double *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),FVar11);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),dp);
        pcVar9 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x35c,pcVar9);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      auVar12._0_4_ = pbrt::InvertTrimmedExponentialSample(local_1a0,c,max);
      auVar12._4_60_ = extraout_var;
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar4._4_4_ = extraout_XMM0_Db;
      auVar4._0_4_ = u;
      auVar4._8_4_ = extraout_XMM0_Dc;
      auVar4._12_4_ = extraout_XMM0_Dd;
      auVar10 = vandps_avx(auVar4,auVar13);
      auVar1 = vandps_avx(auVar12._0_16_,auVar13);
      auVar10 = vminss_avx(auVar1,auVar10);
      fVar2 = u - auVar12._0_4_;
      bVar3 = auVar10._0_4_ < 0.01;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auVar10 = vandps_avx(ZEXT416((uint)bVar3 * (int)fVar2 +
                                   (uint)!bVar3 * (int)((fVar2 + fVar2) / (u + auVar12._0_4_))),
                           auVar13);
      gtest_ar_.success_ = auVar10._0_4_ <= 0.01;
      if (0.01 < auVar10._0_4_) {
        testing::Message::Message((Message *)&local_1a8);
        std::operator<<((ostream *)(CONCAT44(local_1a8.data_._4_4_,local_1a8.data_._0_4_) + 0x10),
                        "u = ");
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_1a8.data_._4_4_,local_1a8.data_._0_4_) + 0x10),u);
        std::operator<<((ostream *)(CONCAT44(local_1a8.data_._4_4_,local_1a8.data_._0_4_) + 0x10),
                        " -> x = ");
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_1a8.data_._4_4_,local_1a8.data_._0_4_) + 0x10),local_1a0)
        ;
        std::operator<<((ostream *)(CONCAT44(local_1a8.data_._4_4_,local_1a8.data_._0_4_) + 0x10),
                        " -> ... ");
        FVar11 = pbrt::InvertTrimmedExponentialSample(local_1a0,c,max);
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_1a8.data_._4_4_,local_1a8.data_._0_4_) + 0x10),FVar11);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"checkErr(u, InvertTrimmedExponentialSample(cx, c, xMax))",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x367,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1a8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(&distrib);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&values);
  }
  return;
}

Assistant:

TEST(Sampling, TrimmedExponential) {
    Float params[][3] = {{1., 2.}, {5, 10}, {.25, 20}};
    for (const auto p : params) {
        Float c = p[0], xMax = p[1];
        auto exp = [&](Float x) { return std::exp(-c * x); };

        auto values = Sample1DFunction(exp, 32768, 16, 0, xMax);
        PiecewiseConstant1D distrib(values, 0, xMax);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedExponential(u, c, xMax);
            Float cp = TrimmedExponentialPDF(cx, c, xMax);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 1e-2)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 1e-2)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedExponentialSample(cx, c, xMax)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedExponentialSample(cx, c, xMax);
        }
    }
}